

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::BVHNIntersector1<4,_257,_true,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  RayQueryContext *extraout_RDX;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar38;
  float fVar39;
  vint4 bi_1;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar45;
  float fVar46;
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  float fVar53;
  float fVar54;
  vfloat4 a0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar61;
  float fVar62;
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar67;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar75;
  float fVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar83;
  float fVar85;
  vint4 bi_3;
  float fVar87;
  undefined1 auVar81 [16];
  float fVar84;
  float fVar86;
  float fVar88;
  undefined1 auVar82 [16];
  float fVar89;
  float fVar90;
  float fVar93;
  float fVar95;
  vint4 bi;
  float fVar97;
  undefined1 auVar91 [16];
  float fVar94;
  float fVar96;
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  ulong local_1098;
  RayHit *local_1090;
  Intersectors *local_1088;
  RayQueryContext *local_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1080 = context;
  local_1088 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fe8 = aVar2.x;
    local_ff8 = aVar2.y;
    local_fd8 = aVar2.z;
    auVar21 = dpps((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar49 = rsqrtss(auVar21,auVar21);
    fVar19 = auVar49._0_4_;
    local_fb8[0] = fVar19 * 1.5 - fVar19 * fVar19 * auVar21._0_4_ * 0.5 * fVar19;
    auVar66._0_4_ = local_fe8 * local_fb8[0];
    auVar66._4_4_ = local_ff8 * local_fb8[0];
    auVar66._8_4_ = local_fd8 * local_fb8[0];
    auVar66._12_4_ = aVar2.field_3.w * local_fb8[0];
    uVar14 = CONCAT44(auVar66._4_4_,auVar66._4_4_);
    auVar22._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar22._8_4_ = -auVar66._12_4_;
    auVar22._12_4_ = -auVar66._12_4_;
    auVar74._0_12_ = ZEXT812(0);
    auVar74._12_4_ = 0;
    auVar22 = blendps(auVar22,auVar74,0xe);
    auVar21._4_4_ = auVar22._0_4_;
    auVar21._0_4_ = auVar66._8_4_;
    auVar21._8_4_ = auVar22._4_4_;
    auVar21._12_4_ = 0;
    auVar49._4_4_ = auVar22._0_4_;
    auVar49._0_4_ = auVar66._8_4_;
    auVar49._8_4_ = auVar22._4_4_;
    auVar49._12_4_ = 0;
    auVar78 = dpps(auVar49 << 0x20,auVar21 << 0x20,0x7f);
    uVar14 = CONCAT44(auVar66._12_4_,auVar66._8_4_);
    auVar69._0_8_ = uVar14 ^ 0x8000000080000000;
    auVar69._8_4_ = -auVar66._8_4_;
    auVar69._12_4_ = -auVar66._12_4_;
    auVar22 = insertps(auVar69,auVar66,0x2a);
    auVar49 = dpps(auVar22,auVar22,0x7f);
    iVar18 = -(uint)(auVar49._0_4_ < auVar78._0_4_);
    auVar78._4_4_ = iVar18;
    auVar78._0_4_ = iVar18;
    auVar78._8_4_ = iVar18;
    auVar78._12_4_ = iVar18;
    auVar21 = blendvps(auVar22,auVar21 << 0x20,auVar78);
    auVar49 = dpps(auVar21,auVar21,0x7f);
    auVar22 = rsqrtss(auVar49,auVar49);
    fVar19 = auVar22._0_4_;
    fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * auVar49._0_4_ * 0.5 * fVar19;
    fVar20 = fVar19 * auVar21._0_4_;
    fVar38 = fVar19 * auVar21._4_4_;
    fVar39 = fVar19 * auVar21._8_4_;
    fVar19 = fVar19 * auVar21._12_4_;
    fVar68 = fVar38 * auVar66._0_4_ - auVar66._4_4_ * fVar20;
    fVar75 = fVar39 * auVar66._4_4_ - auVar66._8_4_ * fVar38;
    fVar76 = fVar20 * auVar66._8_4_ - auVar66._0_4_ * fVar39;
    auVar70._12_4_ = fVar19 * auVar66._12_4_ - auVar66._12_4_ * fVar19;
    auVar70._0_8_ = CONCAT44(fVar76,fVar75);
    auVar70._8_4_ = fVar68;
    auVar77._8_4_ = fVar68;
    auVar77._0_8_ = auVar70._0_8_;
    auVar77._12_4_ = auVar70._12_4_;
    auVar21 = dpps(auVar77,auVar70,0x7f);
    auVar49 = rsqrtss(auVar21,auVar21);
    fVar19 = auVar49._0_4_;
    fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * auVar21._0_4_ * 0.5 * fVar19;
    local_f88._4_4_ = fVar19 * fVar68;
    local_f88._0_4_ = fVar39;
    local_f88._8_4_ = auVar66._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar19 * fVar76;
    local_f98._0_4_ = fVar38;
    local_f98._8_4_ = auVar66._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar19 * fVar75;
    local_fa8._0_4_ = fVar20;
    local_fa8._8_4_ = auVar66._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    pauVar15 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    local_1048 = (ray->super_RayK<1>).org.field_0.m128[0];
    local_1058 = (ray->super_RayK<1>).org.field_0.m128[1];
    local_fc8 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar20 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar19 = 0.0;
    if (0.0 <= fVar20) {
      fVar19 = fVar20;
    }
    fVar20 = (ray->super_RayK<1>).tfar;
    fVar38 = 0.0;
    if (0.0 <= fVar20) {
      fVar38 = fVar20;
    }
    auVar23._4_4_ = -(uint)(ABS(local_ff8) < 1e-18);
    auVar23._0_4_ = -(uint)(ABS(local_fe8) < 1e-18);
    auVar23._8_4_ = -(uint)(ABS(local_fd8) < 1e-18);
    auVar23._12_4_ = -(uint)(ABS(aVar2.field_3.w) < 1e-18);
    auVar21 = divps(_DAT_01f46a60,(undefined1  [16])aVar2);
    auVar21 = blendvps(auVar21,_DAT_01f76a70,auVar23);
    local_1068 = auVar21._0_4_ * 0.99999964;
    local_1078 = auVar21._4_4_ * 0.99999964;
    local_1038 = auVar21._8_4_ * 0.99999964;
    local_10a8 = auVar21._0_4_ * 1.0000004;
    local_10b8 = auVar21._4_4_ * 1.0000004;
    local_1028 = auVar21._8_4_ * 1.0000004;
    fStack_fe4 = local_fe8;
    fStack_fe0 = local_fe8;
    fStack_fdc = local_fe8;
    fStack_ff4 = local_ff8;
    fStack_ff0 = local_ff8;
    fStack_fec = local_ff8;
    fStack_fd4 = local_fd8;
    fStack_fd0 = local_fd8;
    fStack_fcc = local_fd8;
    uVar13 = (ulong)(local_1068 < 0.0) << 4;
    uVar16 = (ulong)(local_1078 < 0.0) << 4 | 0x20;
    uVar17 = (ulong)(local_1038 < 0.0) << 4 | 0x40;
    local_1018._4_4_ = fVar19;
    local_1018._0_4_ = fVar19;
    local_1018._8_4_ = fVar19;
    local_1018._12_4_ = fVar19;
    local_1090 = ray;
    fStack_fc4 = local_fc8;
    fStack_fc0 = local_fc8;
    fStack_fbc = local_fc8;
    fStack_1024 = local_1028;
    fStack_1020 = local_1028;
    fStack_101c = local_1028;
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    local_1098 = uVar13;
    fStack_1064 = local_1068;
    fStack_1060 = local_1068;
    fStack_105c = local_1068;
    fStack_1074 = local_1078;
    fStack_1070 = local_1078;
    fStack_106c = local_1078;
    fStack_10a4 = local_10a8;
    fStack_10a0 = local_10a8;
    fStack_109c = local_10a8;
    fStack_10b4 = local_10b8;
    fStack_10b0 = local_10b8;
    fStack_10ac = local_10b8;
    uVar14 = uVar13;
    fVar19 = fVar38;
    fVar20 = fVar38;
    fVar39 = fVar38;
    auVar21 = local_1018;
    fVar68 = local_1068;
    fVar75 = local_1068;
    fVar76 = local_1068;
    fVar67 = local_1068;
    fVar101 = local_fc8;
    fVar102 = local_fc8;
    fVar103 = local_fc8;
    fVar104 = local_fc8;
    fVar40 = local_1058;
    fVar45 = local_1058;
    fVar46 = local_1058;
    fVar47 = local_1058;
    fVar48 = local_1048;
    fVar53 = local_1048;
    fVar54 = local_1048;
    fVar55 = local_1048;
    fVar56 = local_10a8;
    fVar61 = local_10a8;
    fVar62 = local_10a8;
    fVar63 = local_10a8;
    fVar80 = local_10b8;
    fVar84 = local_10b8;
    fVar86 = local_10b8;
    fVar88 = local_10b8;
    fVar90 = local_1028;
    fVar94 = local_1028;
    fVar96 = local_1028;
    fVar98 = local_1028;
    fVar79 = local_1038;
    fVar83 = local_1038;
    fVar85 = local_1038;
    fVar87 = local_1038;
    fVar89 = local_1078;
    fVar93 = local_1078;
    fVar95 = local_1078;
    fVar97 = local_1078;
LAB_0067c776:
    if (pauVar15 != (undefined1 (*) [16])&local_f78) {
      pauVar9 = pauVar15 + -1;
      pauVar15 = pauVar15 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar9 + 8) < *pfVar1 || *(float *)((long)*pauVar9 + 8) == *pfVar1) {
        uVar10 = *(ulong *)*pauVar15;
LAB_0067c79b:
        if ((uVar10 & 0xf) == 0) {
          pfVar1 = (float *)(uVar10 + 0x20 + uVar14);
          auVar24._0_4_ = (*pfVar1 - fVar48) * fVar68;
          auVar24._4_4_ = (pfVar1[1] - fVar53) * fVar75;
          auVar24._8_4_ = (pfVar1[2] - fVar54) * fVar76;
          auVar24._12_4_ = (pfVar1[3] - fVar55) * fVar67;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar16);
          auVar41._0_4_ = (*pfVar1 - fVar40) * fVar89;
          auVar41._4_4_ = (pfVar1[1] - fVar45) * fVar93;
          auVar41._8_4_ = (pfVar1[2] - fVar46) * fVar95;
          auVar41._12_4_ = (pfVar1[3] - fVar47) * fVar97;
          auVar49 = maxps(auVar24,auVar41);
          pfVar1 = (float *)(uVar10 + 0x20 + uVar17);
          auVar42._0_4_ = (*pfVar1 - fVar101) * fVar79;
          auVar42._4_4_ = (pfVar1[1] - fVar102) * fVar83;
          auVar42._8_4_ = (pfVar1[2] - fVar103) * fVar85;
          auVar42._12_4_ = (pfVar1[3] - fVar104) * fVar87;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar13 ^ 0x10));
          auVar50._0_4_ = (*pfVar1 - fVar48) * fVar56;
          auVar50._4_4_ = (pfVar1[1] - fVar53) * fVar61;
          auVar50._8_4_ = (pfVar1[2] - fVar54) * fVar62;
          auVar50._12_4_ = (pfVar1[3] - fVar55) * fVar63;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar16 ^ 0x10));
          auVar57._0_4_ = (*pfVar1 - fVar40) * fVar80;
          auVar57._4_4_ = (pfVar1[1] - fVar45) * fVar84;
          auVar57._8_4_ = (pfVar1[2] - fVar46) * fVar86;
          auVar57._12_4_ = (pfVar1[3] - fVar47) * fVar88;
          auVar78 = minps(auVar50,auVar57);
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar17 ^ 0x10));
          auVar58._0_4_ = (*pfVar1 - fVar101) * fVar90;
          auVar58._4_4_ = (pfVar1[1] - fVar102) * fVar94;
          auVar58._8_4_ = (pfVar1[2] - fVar103) * fVar96;
          auVar58._12_4_ = (pfVar1[3] - fVar104) * fVar98;
          auVar22 = maxps(auVar42,auVar21);
          _local_10c8 = maxps(auVar49,auVar22);
          auVar8._4_4_ = fVar19;
          auVar8._0_4_ = fVar38;
          auVar8._8_4_ = fVar20;
          auVar8._12_4_ = fVar39;
          auVar49 = minps(auVar58,auVar8);
          auVar49 = minps(auVar78,auVar49);
          auVar25._4_4_ = -(uint)(local_10c8._4_4_ <= auVar49._4_4_);
          auVar25._0_4_ = -(uint)(local_10c8._0_4_ <= auVar49._0_4_);
          auVar25._8_4_ = -(uint)(local_10c8._8_4_ <= auVar49._8_4_);
          auVar25._12_4_ = -(uint)(local_10c8._12_4_ <= auVar49._12_4_);
          uVar12 = movmskps((int)context,auVar25);
        }
        else {
          if ((int)(uVar10 & 0xf) != 2) {
            (**(code **)((long)local_1088->leafIntersector +
                        (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1080);
            fVar38 = (local_1090->super_RayK<1>).tfar;
            context = extraout_RDX;
            ray = local_1090;
            uVar14 = local_1098;
            fVar19 = fVar38;
            fVar20 = fVar38;
            fVar39 = fVar38;
            auVar21 = local_1018;
            fVar68 = local_1068;
            fVar75 = fStack_1064;
            fVar76 = fStack_1060;
            fVar67 = fStack_105c;
            fVar101 = local_fc8;
            fVar102 = fStack_fc4;
            fVar103 = fStack_fc0;
            fVar104 = fStack_fbc;
            fVar40 = local_1058;
            fVar45 = fStack_1054;
            fVar46 = fStack_1050;
            fVar47 = fStack_104c;
            fVar48 = local_1048;
            fVar53 = fStack_1044;
            fVar54 = fStack_1040;
            fVar55 = fStack_103c;
            fVar56 = local_10a8;
            fVar61 = fStack_10a4;
            fVar62 = fStack_10a0;
            fVar63 = fStack_109c;
            fVar80 = local_10b8;
            fVar84 = fStack_10b4;
            fVar86 = fStack_10b0;
            fVar88 = fStack_10ac;
            fVar90 = local_1028;
            fVar94 = fStack_1024;
            fVar96 = fStack_1020;
            fVar98 = fStack_101c;
            fVar79 = local_1038;
            fVar83 = fStack_1034;
            fVar85 = fStack_1030;
            fVar87 = fStack_102c;
            fVar89 = local_1078;
            fVar93 = fStack_1074;
            fVar95 = fStack_1070;
            fVar97 = fStack_106c;
            goto LAB_0067c776;
          }
          uVar11 = uVar10 & 0xfffffffffffffff0;
          local_1008 = *(float *)(uVar11 + 0x70);
          fStack_1004 = *(float *)(uVar11 + 0x74);
          fStack_1000 = *(float *)(uVar11 + 0x78);
          fStack_ffc = *(float *)(uVar11 + 0x7c);
          auVar100._0_4_ = local_ff8 * local_1008 + local_fd8 * *(float *)(uVar11 + 0xa0);
          auVar100._4_4_ = fStack_ff4 * fStack_1004 + fStack_fd4 * *(float *)(uVar11 + 0xa4);
          auVar100._8_4_ = fStack_ff0 * fStack_1000 + fStack_fd0 * *(float *)(uVar11 + 0xa8);
          auVar100._12_4_ = fStack_fec * fStack_ffc + fStack_fcc * *(float *)(uVar11 + 0xac);
          auVar81._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x20) +
               local_ff8 * *(float *)(uVar11 + 0x50) + local_fd8 * *(float *)(uVar11 + 0x80);
          auVar81._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x24) +
               fStack_ff4 * *(float *)(uVar11 + 0x54) + fStack_fd4 * *(float *)(uVar11 + 0x84);
          auVar81._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x28) +
               fStack_ff0 * *(float *)(uVar11 + 0x58) + fStack_fd0 * *(float *)(uVar11 + 0x88);
          auVar81._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x2c) +
               fStack_fec * *(float *)(uVar11 + 0x5c) + fStack_fcc * *(float *)(uVar11 + 0x8c);
          auVar91._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x30) +
               local_ff8 * *(float *)(uVar11 + 0x60) + local_fd8 * *(float *)(uVar11 + 0x90);
          auVar91._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x34) +
               fStack_ff4 * *(float *)(uVar11 + 100) + fStack_fd4 * *(float *)(uVar11 + 0x94);
          auVar91._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x38) +
               fStack_ff0 * *(float *)(uVar11 + 0x68) + fStack_fd0 * *(float *)(uVar11 + 0x98);
          auVar91._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x3c) +
               fStack_fec * *(float *)(uVar11 + 0x6c) + fStack_fcc * *(float *)(uVar11 + 0x9c);
          fVar68 = (float)DAT_01f4bd50;
          fVar75 = DAT_01f4bd50._4_4_;
          fVar76 = DAT_01f4bd50._8_4_;
          fVar67 = DAT_01f4bd50._12_4_;
          auVar26._4_4_ = -(uint)(ABS(auVar81._4_4_) < fVar75);
          auVar26._0_4_ = -(uint)(ABS(auVar81._0_4_) < fVar68);
          auVar26._8_4_ = -(uint)(ABS(auVar81._8_4_) < fVar76);
          auVar26._12_4_ = -(uint)(ABS(auVar81._12_4_) < fVar67);
          auVar21 = blendvps(auVar81,_DAT_01f4bd50,auVar26);
          auVar27._4_4_ = -(uint)(ABS(auVar91._4_4_) < fVar75);
          auVar27._0_4_ = -(uint)(ABS(auVar91._0_4_) < fVar68);
          auVar27._8_4_ = -(uint)(ABS(auVar91._8_4_) < fVar76);
          auVar27._12_4_ = -(uint)(ABS(auVar91._12_4_) < fVar67);
          auVar49 = blendvps(auVar91,_DAT_01f4bd50,auVar27);
          auVar99._0_4_ = local_fe8 * *(float *)(uVar11 + 0x40) + auVar100._0_4_;
          auVar99._4_4_ = fStack_fe4 * *(float *)(uVar11 + 0x44) + auVar100._4_4_;
          auVar99._8_4_ = fStack_fe0 * *(float *)(uVar11 + 0x48) + auVar100._8_4_;
          auVar99._12_4_ = fStack_fdc * *(float *)(uVar11 + 0x4c) + auVar100._12_4_;
          auVar28._4_4_ = -(uint)(ABS(auVar99._4_4_) < fVar75);
          auVar28._0_4_ = -(uint)(ABS(auVar99._0_4_) < fVar68);
          auVar28._8_4_ = -(uint)(ABS(auVar99._8_4_) < fVar76);
          auVar28._12_4_ = -(uint)(ABS(auVar99._12_4_) < fVar67);
          auVar22 = blendvps(auVar99,_DAT_01f4bd50,auVar28);
          auVar78 = rcpps(auVar100,auVar21);
          fVar68 = auVar78._0_4_;
          fVar75 = auVar78._4_4_;
          fVar76 = auVar78._8_4_;
          fVar67 = auVar78._12_4_;
          fVar68 = (1.0 - auVar21._0_4_ * fVar68) * fVar68 + fVar68;
          fVar75 = (1.0 - auVar21._4_4_ * fVar75) * fVar75 + fVar75;
          fVar76 = (1.0 - auVar21._8_4_ * fVar76) * fVar76 + fVar76;
          fVar67 = (1.0 - auVar21._12_4_ * fVar67) * fVar67 + fVar67;
          auVar21 = rcpps(auVar78,auVar49);
          fVar80 = auVar21._0_4_;
          fVar84 = auVar21._4_4_;
          fVar86 = auVar21._8_4_;
          fVar88 = auVar21._12_4_;
          fVar80 = (1.0 - auVar49._0_4_ * fVar80) * fVar80 + fVar80;
          fVar84 = (1.0 - auVar49._4_4_ * fVar84) * fVar84 + fVar84;
          fVar86 = (1.0 - auVar49._8_4_ * fVar86) * fVar86 + fVar86;
          fVar88 = (1.0 - auVar49._12_4_ * fVar88) * fVar88 + fVar88;
          auVar21 = rcpps(auVar21,auVar22);
          fVar90 = auVar21._0_4_;
          fVar94 = auVar21._4_4_;
          fVar96 = auVar21._8_4_;
          fVar98 = auVar21._12_4_;
          fVar90 = (1.0 - auVar22._0_4_ * fVar90) * fVar90 + fVar90;
          fVar94 = (1.0 - auVar22._4_4_ * fVar94) * fVar94 + fVar94;
          fVar96 = (1.0 - auVar22._8_4_ * fVar96) * fVar96 + fVar96;
          fVar98 = (1.0 - auVar22._12_4_ * fVar98) * fVar98 + fVar98;
          fVar56 = (*(float *)(uVar11 + 0x20) * local_1048 +
                   *(float *)(uVar11 + 0x50) * local_1058 +
                   *(float *)(uVar11 + 0x80) * fVar101 + *(float *)(uVar11 + 0xb0)) * -fVar68;
          fVar61 = (*(float *)(uVar11 + 0x24) * fStack_1044 +
                   *(float *)(uVar11 + 0x54) * fStack_1054 +
                   *(float *)(uVar11 + 0x84) * fVar102 + *(float *)(uVar11 + 0xb4)) * -fVar75;
          fVar62 = (*(float *)(uVar11 + 0x28) * fStack_1040 +
                   *(float *)(uVar11 + 0x58) * fStack_1050 +
                   *(float *)(uVar11 + 0x88) * fVar103 + *(float *)(uVar11 + 0xb8)) * -fVar76;
          fVar63 = (*(float *)(uVar11 + 0x2c) * fStack_103c +
                   *(float *)(uVar11 + 0x5c) * fStack_104c +
                   *(float *)(uVar11 + 0x8c) * fVar104 + *(float *)(uVar11 + 0xbc)) * -fVar67;
          fVar48 = (*(float *)(uVar11 + 0x30) * local_1048 +
                   *(float *)(uVar11 + 0x60) * local_1058 +
                   *(float *)(uVar11 + 0x90) * fVar101 + *(float *)(uVar11 + 0xc0)) * -fVar80;
          fVar53 = (*(float *)(uVar11 + 0x34) * fStack_1044 +
                   *(float *)(uVar11 + 100) * fStack_1054 +
                   *(float *)(uVar11 + 0x94) * fVar102 + *(float *)(uVar11 + 0xc4)) * -fVar84;
          fVar54 = (*(float *)(uVar11 + 0x38) * fStack_1040 +
                   *(float *)(uVar11 + 0x68) * fStack_1050 +
                   *(float *)(uVar11 + 0x98) * fVar103 + *(float *)(uVar11 + 200)) * -fVar86;
          fVar55 = (*(float *)(uVar11 + 0x3c) * fStack_103c +
                   *(float *)(uVar11 + 0x6c) * fStack_104c +
                   *(float *)(uVar11 + 0x9c) * fVar104 + *(float *)(uVar11 + 0xcc)) * -fVar88;
          fVar40 = (*(float *)(uVar11 + 0x40) * local_1048 +
                   local_1008 * local_1058 +
                   *(float *)(uVar11 + 0xa0) * fVar101 + *(float *)(uVar11 + 0xd0)) * -fVar90;
          fVar45 = (*(float *)(uVar11 + 0x44) * fStack_1044 +
                   fStack_1004 * fStack_1054 +
                   *(float *)(uVar11 + 0xa4) * fVar102 + *(float *)(uVar11 + 0xd4)) * -fVar94;
          fVar46 = (*(float *)(uVar11 + 0x48) * fStack_1040 +
                   fStack_1000 * fStack_1050 +
                   *(float *)(uVar11 + 0xa8) * fVar103 + *(float *)(uVar11 + 0xd8)) * -fVar96;
          fVar47 = (*(float *)(uVar11 + 0x4c) * fStack_103c +
                   fStack_ffc * fStack_104c +
                   *(float *)(uVar11 + 0xac) * fVar104 + *(float *)(uVar11 + 0xdc)) * -fVar98;
          fVar68 = fVar68 + fVar56;
          fVar75 = fVar75 + fVar61;
          fVar76 = fVar76 + fVar62;
          fVar67 = fVar67 + fVar63;
          fVar80 = fVar80 + fVar48;
          fVar84 = fVar84 + fVar53;
          fVar86 = fVar86 + fVar54;
          fVar88 = fVar88 + fVar55;
          fVar90 = fVar90 + fVar40;
          fVar94 = fVar94 + fVar45;
          fVar96 = fVar96 + fVar46;
          fVar98 = fVar98 + fVar47;
          auVar64._0_4_ =
               (uint)((int)fVar80 < (int)fVar48) * (int)fVar80 |
               (uint)((int)fVar80 >= (int)fVar48) * (int)fVar48;
          auVar64._4_4_ =
               (uint)((int)fVar84 < (int)fVar53) * (int)fVar84 |
               (uint)((int)fVar84 >= (int)fVar53) * (int)fVar53;
          auVar64._8_4_ =
               (uint)((int)fVar86 < (int)fVar54) * (int)fVar86 |
               (uint)((int)fVar86 >= (int)fVar54) * (int)fVar54;
          auVar64._12_4_ =
               (uint)((int)fVar88 < (int)fVar55) * (int)fVar88 |
               (uint)((int)fVar88 >= (int)fVar55) * (int)fVar55;
          auVar71._0_4_ =
               (uint)((int)fVar90 < (int)fVar40) * (int)fVar90 |
               (uint)((int)fVar90 >= (int)fVar40) * (int)fVar40;
          auVar71._4_4_ =
               (uint)((int)fVar94 < (int)fVar45) * (int)fVar94 |
               (uint)((int)fVar94 >= (int)fVar45) * (int)fVar45;
          auVar71._8_4_ =
               (uint)((int)fVar96 < (int)fVar46) * (int)fVar96 |
               (uint)((int)fVar96 >= (int)fVar46) * (int)fVar46;
          auVar71._12_4_ =
               (uint)((int)fVar98 < (int)fVar47) * (int)fVar98 |
               (uint)((int)fVar98 >= (int)fVar47) * (int)fVar47;
          auVar49 = maxps(auVar64,auVar71);
          auVar72._0_4_ =
               (uint)((int)fVar68 < (int)fVar56) * (int)fVar68 |
               (uint)((int)fVar68 >= (int)fVar56) * (int)fVar56;
          auVar72._4_4_ =
               (uint)((int)fVar75 < (int)fVar61) * (int)fVar75 |
               (uint)((int)fVar75 >= (int)fVar61) * (int)fVar61;
          auVar72._8_4_ =
               (uint)((int)fVar76 < (int)fVar62) * (int)fVar76 |
               (uint)((int)fVar76 >= (int)fVar62) * (int)fVar62;
          auVar72._12_4_ =
               (uint)((int)fVar67 < (int)fVar63) * (int)fVar67 |
               (uint)((int)fVar67 >= (int)fVar63) * (int)fVar63;
          auVar29._0_4_ =
               (uint)((int)fVar68 < (int)fVar56) * (int)fVar56 |
               (uint)((int)fVar68 >= (int)fVar56) * (int)fVar68;
          auVar29._4_4_ =
               (uint)((int)fVar75 < (int)fVar61) * (int)fVar61 |
               (uint)((int)fVar75 >= (int)fVar61) * (int)fVar75;
          auVar29._8_4_ =
               (uint)((int)fVar76 < (int)fVar62) * (int)fVar62 |
               (uint)((int)fVar76 >= (int)fVar62) * (int)fVar76;
          auVar29._12_4_ =
               (uint)((int)fVar67 < (int)fVar63) * (int)fVar63 |
               (uint)((int)fVar67 >= (int)fVar63) * (int)fVar67;
          auVar82._0_4_ =
               (uint)((int)fVar80 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar80 >= (int)fVar48) * (int)fVar80;
          auVar82._4_4_ =
               (uint)((int)fVar84 < (int)fVar53) * (int)fVar53 |
               (uint)((int)fVar84 >= (int)fVar53) * (int)fVar84;
          auVar82._8_4_ =
               (uint)((int)fVar86 < (int)fVar54) * (int)fVar54 |
               (uint)((int)fVar86 >= (int)fVar54) * (int)fVar86;
          auVar82._12_4_ =
               (uint)((int)fVar88 < (int)fVar55) * (int)fVar55 |
               (uint)((int)fVar88 >= (int)fVar55) * (int)fVar88;
          auVar92._0_4_ =
               (uint)((int)fVar90 < (int)fVar40) * (int)fVar40 |
               (uint)((int)fVar90 >= (int)fVar40) * (int)fVar90;
          auVar92._4_4_ =
               (uint)((int)fVar94 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar94 >= (int)fVar45) * (int)fVar94;
          auVar92._8_4_ =
               (uint)((int)fVar96 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar96 >= (int)fVar46) * (int)fVar96;
          auVar92._12_4_ =
               (uint)((int)fVar98 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar98 >= (int)fVar47) * (int)fVar98;
          auVar22 = minps(auVar82,auVar92);
          auVar21 = maxps(local_1018,auVar72);
          auVar21 = maxps(auVar21,auVar49);
          auVar51._4_4_ = fVar19;
          auVar51._0_4_ = fVar38;
          auVar51._8_4_ = fVar20;
          auVar51._12_4_ = fVar39;
          auVar49 = minps(auVar51,auVar29);
          auVar49 = minps(auVar49,auVar22);
          local_10c8._0_4_ = auVar21._0_4_ * 0.99999964;
          local_10c8._4_4_ = auVar21._4_4_ * 0.99999964;
          fStack_10c0 = auVar21._8_4_ * 0.99999964;
          fStack_10bc = auVar21._12_4_ * 0.99999964;
          auVar43._4_4_ = -(uint)((float)local_10c8._4_4_ <= auVar49._4_4_ * 1.0000004);
          auVar43._0_4_ = -(uint)((float)local_10c8._0_4_ <= auVar49._0_4_ * 1.0000004);
          auVar43._8_4_ = -(uint)(fStack_10c0 <= auVar49._8_4_ * 1.0000004);
          auVar43._12_4_ = -(uint)(fStack_10bc <= auVar49._12_4_ * 1.0000004);
          uVar12 = movmskps((int)context,auVar43);
          auVar21 = local_1018;
          fVar68 = local_1068;
          fVar75 = fStack_1064;
          fVar76 = fStack_1060;
          fVar67 = fStack_105c;
          fVar40 = local_1058;
          fVar45 = fStack_1054;
          fVar46 = fStack_1050;
          fVar47 = fStack_104c;
          fVar48 = local_1048;
          fVar53 = fStack_1044;
          fVar54 = fStack_1040;
          fVar55 = fStack_103c;
          fVar56 = local_10a8;
          fVar61 = fStack_10a4;
          fVar62 = fStack_10a0;
          fVar63 = fStack_109c;
          fVar80 = local_10b8;
          fVar84 = fStack_10b4;
          fVar86 = fStack_10b0;
          fVar88 = fStack_10ac;
          fVar90 = local_1028;
          fVar94 = fStack_1024;
          fVar96 = fStack_1020;
          fVar98 = fStack_101c;
          fVar79 = local_1038;
          fVar83 = fStack_1034;
          fVar85 = fStack_1030;
          fVar87 = fStack_102c;
          fVar89 = local_1078;
          fVar93 = fStack_1074;
          fVar95 = fStack_1070;
          fVar97 = fStack_106c;
        }
        context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar12);
        if (context == (RayQueryContext *)0x0) goto LAB_0067c776;
        uVar11 = uVar10 & 0xfffffffffffffff0;
        lVar7 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((ulong)context >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar11 + lVar7 * 8);
        uVar12 = uVar12 - 1 & uVar12;
        if (uVar12 != 0) {
          uVar3 = *(uint *)(local_10c8 + lVar7 * 4);
          lVar7 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar5 = *(ulong *)(uVar11 + lVar7 * 8);
          uVar4 = *(uint *)(local_10c8 + lVar7 * 4);
          uVar12 = uVar12 - 1 & uVar12;
          context = (RayQueryContext *)(ulong)uVar12;
          if (uVar12 == 0) {
            if (uVar3 < uVar4) {
              *(ulong *)*pauVar15 = uVar5;
              *(uint *)((long)*pauVar15 + 8) = uVar4;
              pauVar15 = pauVar15 + 1;
            }
            else {
              *(ulong *)*pauVar15 = uVar10;
              *(uint *)((long)*pauVar15 + 8) = uVar3;
              uVar10 = uVar5;
              pauVar15 = pauVar15 + 1;
            }
          }
          else {
            auVar44._8_4_ = uVar3;
            auVar44._0_8_ = uVar10;
            auVar44._12_4_ = 0;
            auVar59._8_4_ = uVar4;
            auVar59._0_8_ = uVar5;
            auVar59._12_4_ = 0;
            lVar7 = 0;
            if (context != (RayQueryContext *)0x0) {
              for (; (uVar12 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar6 = *(undefined8 *)(uVar11 + lVar7 * 8);
            iVar18 = *(int *)(local_10c8 + lVar7 * 4);
            auVar52._8_4_ = iVar18;
            auVar52._0_8_ = uVar6;
            auVar52._12_4_ = 0;
            auVar30._8_4_ = -(uint)((int)uVar3 < (int)uVar4);
            uVar12 = uVar12 - 1 & uVar12;
            if (uVar12 == 0) {
              auVar30._4_4_ = auVar30._8_4_;
              auVar30._0_4_ = auVar30._8_4_;
              auVar30._12_4_ = auVar30._8_4_;
              auVar65._8_4_ = uVar4;
              auVar65._0_8_ = uVar5;
              auVar65._12_4_ = 0;
              auVar22 = blendvps(auVar65,auVar44,auVar30);
              auVar49 = blendvps(auVar44,auVar59,auVar30);
              auVar31._8_4_ = -(uint)(auVar22._8_4_ < iVar18);
              auVar31._4_4_ = auVar31._8_4_;
              auVar31._0_4_ = auVar31._8_4_;
              auVar31._12_4_ = auVar31._8_4_;
              auVar60._8_4_ = iVar18;
              auVar60._0_8_ = uVar6;
              auVar60._12_4_ = 0;
              auVar78 = blendvps(auVar60,auVar22,auVar31);
              auVar66 = blendvps(auVar22,auVar52,auVar31);
              auVar32._8_4_ = -(uint)(auVar49._8_4_ < auVar66._8_4_);
              auVar32._4_4_ = auVar32._8_4_;
              auVar32._0_4_ = auVar32._8_4_;
              auVar32._12_4_ = auVar32._8_4_;
              auVar22 = blendvps(auVar66,auVar49,auVar32);
              auVar49 = blendvps(auVar49,auVar66,auVar32);
              *pauVar15 = auVar49;
              pauVar15[1] = auVar22;
              uVar10 = auVar78._0_8_;
              pauVar15 = pauVar15 + 2;
            }
            else {
              lVar7 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              auVar33._4_4_ = auVar30._8_4_;
              auVar33._0_4_ = auVar30._8_4_;
              auVar33._8_4_ = auVar30._8_4_;
              auVar33._12_4_ = auVar30._8_4_;
              auVar66 = blendvps(auVar59,auVar44,auVar33);
              auVar49 = blendvps(auVar44,auVar59,auVar33);
              auVar73._8_4_ = *(int *)(local_10c8 + lVar7 * 4);
              auVar73._0_8_ = *(undefined8 *)(uVar11 + lVar7 * 8);
              auVar73._12_4_ = 0;
              auVar34._8_4_ = -(uint)(iVar18 < *(int *)(local_10c8 + lVar7 * 4));
              auVar34._4_4_ = auVar34._8_4_;
              auVar34._0_4_ = auVar34._8_4_;
              auVar34._12_4_ = auVar34._8_4_;
              auVar78 = blendvps(auVar73,auVar52,auVar34);
              auVar22 = blendvps(auVar52,auVar73,auVar34);
              auVar35._8_4_ = -(uint)(auVar49._8_4_ < auVar22._8_4_);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar74 = blendvps(auVar22,auVar49,auVar35);
              auVar49 = blendvps(auVar49,auVar22,auVar35);
              auVar36._8_4_ = -(uint)(auVar66._8_4_ < auVar78._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              auVar22 = blendvps(auVar78,auVar66,auVar36);
              auVar66 = blendvps(auVar66,auVar78,auVar36);
              auVar37._8_4_ = -(uint)(auVar66._8_4_ < auVar74._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              auVar78 = blendvps(auVar74,auVar66,auVar37);
              auVar66 = blendvps(auVar66,auVar74,auVar37);
              *pauVar15 = auVar49;
              pauVar15[1] = auVar66;
              pauVar15[2] = auVar78;
              uVar10 = auVar22._0_8_;
              pauVar15 = pauVar15 + 3;
              fVar56 = local_10a8;
              fVar61 = fStack_10a4;
              fVar62 = fStack_10a0;
              fVar63 = fStack_109c;
              fVar80 = local_10b8;
              fVar84 = fStack_10b4;
              fVar86 = fStack_10b0;
              fVar88 = fStack_10ac;
            }
          }
        }
        goto LAB_0067c79b;
      }
      goto LAB_0067c776;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }